

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool wildcard_match_rec(char *wildcard,char *target)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  char *in_RSI;
  char *in_RDI;
  size_t t_skip;
  size_t w_skip;
  char *pt;
  char *pw;
  char *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (*local_28 == '\0') {
      do {
        if (*in_RDI == '\0') {
          return true;
        }
        cVar1 = *in_RDI;
        in_RDI = in_RDI + 1;
      } while (cVar1 == '*');
      return false;
    }
    if (*in_RDI == '\0') {
      return false;
    }
    sVar3 = get_step_filechar((uchar *)0x1947c0);
    sVar4 = get_step_filechar((uchar *)0x1947cf);
    if (*in_RDI == '*') break;
    if ((*in_RDI != '?') && (*in_RDI != *local_28)) {
      return false;
    }
    in_RDI = in_RDI + sVar3;
    local_28 = local_28 + sVar4;
  }
  if (in_RDI[sVar3] == '\0') {
    return true;
  }
  _Var2 = wildcard_match_rec(in_RSI,in_RDI);
  if (!_Var2) {
    _Var2 = wildcard_match_rec(in_RSI,in_RDI);
    return _Var2;
  }
  return true;
}

Assistant:

bool wildcard_match_rec(const char *wildcard, const char *target)
{
	const char *pw = wildcard;
	const char *pt = target;
	while (true)
	{
		if (*pt == '\0')
		{
			while (*pw != '\0')
			{
				if (*pw++ != '*')
				{
					return false;
				}
			}
			return true;
		}
		else if (*pw == '\0')
		{
			return false;
		}
		size_t w_skip = get_step_filechar((unsigned char *)pw);
		size_t t_skip = get_step_filechar((unsigned char *)pt);
		if (*pw == '*')
		{
			if (*(pw + w_skip) == '\0')
			{
				return true;
			}
			else if (wildcard_match_rec(pw, pt + t_skip))
			{
				return true;
			}
			else
			{
				return wildcard_match_rec(pw + w_skip, pt);
			}
		}
		else if (*pw == '?' || (*pw == *pt))
		{
			pw += w_skip;
			pt += t_skip;
			continue;
		}
		else
		{
			return false;
		}
	}
}